

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineRenderToImageTests.cpp
# Opt level: O1

Move<vk::Handle<(vk::HandleType)17>_> *
vkt::pipeline::anon_unknown_0::makeRenderPass
          (Move<vk::Handle<(vk::HandleType)17>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device,VkFormat colorFormat,VkFormat depthStencilFormat,deUint32 numLayers,
          VkImageLayout initialColorImageLayout,VkImageLayout initialDepthStencilImageLayout)

{
  VkPipelineBindPoint VVar1;
  Move<vk::Handle<(vk::HandleType)17>_> *pMVar2;
  long lVar3;
  long lVar4;
  VkSubpassDescription *pVVar5;
  iterator iVar6;
  ulong __n;
  ulong uVar7;
  byte bVar8;
  vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
  attachmentDescriptions;
  vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
  depthStencilAttachmentReferences;
  vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
  colorAttachmentReferences;
  VkRenderPassCreateInfo renderPassInfo;
  VkAttachmentDescription depthStencilAttachmentDescription;
  VkAttachmentDescription colorAttachmentDescription;
  VkSubpassDescription *local_138;
  iterator iStack_130;
  VkSubpassDescription *local_128;
  vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_> local_120;
  DeviceInterface *local_108;
  VkDevice local_100;
  Move<vk::Handle<(vk::HandleType)17>_> *local_f8;
  vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_> local_f0;
  vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_> local_d8;
  undefined1 local_c0 [8];
  void *local_b8;
  VkAttachmentReference *local_b0;
  pointer local_a8;
  VkAttachmentReference *local_a0;
  VkSubpassDescription *local_98;
  undefined8 local_90;
  VkSubpassDependency *local_88;
  deUint32 *local_80;
  value_type local_78;
  value_type local_54;
  
  bVar8 = 0;
  local_54.flags = 0;
  local_54.samples = VK_SAMPLE_COUNT_1_BIT;
  local_54.loadOp = VK_ATTACHMENT_LOAD_OP_CLEAR;
  local_54.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
  local_54.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_DONT_CARE;
  local_54.stencilStoreOp = VK_ATTACHMENT_STORE_OP_DONT_CARE;
  local_54.initialLayout = initialColorImageLayout;
  local_54.finalLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  __n = (ulong)numLayers;
  local_108 = vk;
  local_100 = device;
  local_f8 = __return_storage_ptr__;
  local_54.format = colorFormat;
  std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::vector
            (&local_120,__n,&local_54,(allocator_type *)local_c0);
  local_78.flags = 0;
  local_78.samples = VK_SAMPLE_COUNT_1_BIT;
  local_78.loadOp = VK_ATTACHMENT_LOAD_OP_CLEAR;
  local_78.storeOp = VK_ATTACHMENT_STORE_OP_DONT_CARE;
  local_78.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_CLEAR;
  local_78.stencilStoreOp = VK_ATTACHMENT_STORE_OP_DONT_CARE;
  local_78.initialLayout = initialDepthStencilImageLayout;
  local_78.finalLayout = VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL;
  local_78.format = depthStencilFormat;
  if (depthStencilFormat != VK_FORMAT_UNDEFINED) {
    std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::
    _M_fill_insert(&local_120,
                   (iterator)
                   local_120.
                   super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                   ._M_impl.super__Vector_impl_data._M_finish,__n,&local_78);
  }
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::vector
            (&local_d8,__n,(allocator_type *)local_c0);
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::vector
            (&local_f0,__n,(allocator_type *)local_c0);
  local_138 = (VkSubpassDescription *)0x0;
  iStack_130._M_current = (VkSubpassDescription *)0x0;
  local_128 = (VkSubpassDescription *)0x0;
  if (numLayers != 0) {
    lVar4 = 0;
    uVar7 = 0;
    do {
      *(int *)((long)&(local_d8.
                       super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                       ._M_impl.super__Vector_impl_data._M_start)->attachment + lVar4) = (int)uVar7;
      *(undefined4 *)
       ((long)&(local_d8.
                super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                ._M_impl.super__Vector_impl_data._M_start)->layout + lVar4) = 2;
      *(deUint32 *)
       ((long)&(local_f0.
                super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                ._M_impl.super__Vector_impl_data._M_start)->attachment + lVar4) =
           numLayers + (int)uVar7;
      *(undefined4 *)
       ((long)&(local_f0.
                super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                ._M_impl.super__Vector_impl_data._M_start)->layout + lVar4) = 3;
      local_90 = (VkAttachmentReference *)
                 ((long)&(local_f0.
                          super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                          ._M_impl.super__Vector_impl_data._M_start)->attachment + lVar4);
      if (depthStencilFormat == VK_FORMAT_UNDEFINED) {
        local_90 = (VkAttachmentReference *)0x0;
      }
      local_c0._0_4_ = 0;
      local_c0._4_4_ = VK_PIPELINE_BIND_POINT_GRAPHICS;
      local_b8 = (void *)((ulong)local_b8 & 0xffffffff00000000);
      local_b0 = (VkAttachmentReference *)0x0;
      local_a8 = (pointer)CONCAT44(local_a8._4_4_,1);
      local_a0 = (VkAttachmentReference *)
                 ((long)&(local_d8.
                          super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                          ._M_impl.super__Vector_impl_data._M_start)->attachment + lVar4);
      local_98 = (VkSubpassDescription *)0x0;
      local_88 = (VkSubpassDependency *)((ulong)local_88 & 0xffffffff00000000);
      local_80 = (deUint32 *)0x0;
      if (iStack_130._M_current == local_128) {
        std::vector<vk::VkSubpassDescription,std::allocator<vk::VkSubpassDescription>>::
        _M_realloc_insert<vk::VkSubpassDescription_const&>
                  ((vector<vk::VkSubpassDescription,std::allocator<vk::VkSubpassDescription>> *)
                   &local_138,iStack_130,(VkSubpassDescription *)local_c0);
      }
      else {
        pVVar5 = (VkSubpassDescription *)local_c0;
        iVar6._M_current = iStack_130._M_current;
        for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
          VVar1 = pVVar5->pipelineBindPoint;
          (iVar6._M_current)->flags = pVVar5->flags;
          (iVar6._M_current)->pipelineBindPoint = VVar1;
          pVVar5 = (VkSubpassDescription *)((long)pVVar5 + (ulong)bVar8 * -0x10 + 8);
          iVar6._M_current = iVar6._M_current + (ulong)bVar8 * -0x10 + 8;
        }
        iStack_130._M_current = iStack_130._M_current + 1;
      }
      uVar7 = uVar7 + 1;
      lVar4 = lVar4 + 8;
    } while (__n != uVar7);
  }
  pMVar2 = local_f8;
  local_c0._0_4_ = 0x26;
  local_b8 = (void *)0x0;
  local_b0 = (VkAttachmentReference *)
             ((ulong)(uint)((int)((ulong)((long)local_120.
                                                super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_120.
                                               super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                           0x38e38e39) << 0x20);
  local_a8 = local_120.
             super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_a0 = (VkAttachmentReference *)
             CONCAT44(local_a0._4_4_,
                      (int)((ulong)((long)iStack_130._M_current - (long)local_138) >> 3) *
                      0x38e38e39);
  local_98 = local_138;
  local_90 = (VkAttachmentReference *)((ulong)local_90._4_4_ << 0x20);
  local_88 = (VkSubpassDependency *)0x0;
  ::vk::createRenderPass
            (local_f8,local_108,local_100,(VkRenderPassCreateInfo *)local_c0,
             (VkAllocationCallbacks *)0x0);
  if (local_138 != (VkSubpassDescription *)0x0) {
    operator_delete(local_138,(long)local_128 - (long)local_138);
  }
  if (local_f0.
      super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.
                    super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f0.
                          super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.
                          super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.
      super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_120.
      super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.
                    super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_120.
                          super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_120.
                          super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pMVar2;
}

Assistant:

Move<VkRenderPass> makeRenderPass (const DeviceInterface&		vk,
								   const VkDevice				device,
								   const VkFormat				colorFormat,
								   const VkFormat				depthStencilFormat,
								   const deUint32				numLayers,
								   const VkImageLayout			initialColorImageLayout			= VK_IMAGE_LAYOUT_UNDEFINED,
								   const VkImageLayout			initialDepthStencilImageLayout	= VK_IMAGE_LAYOUT_UNDEFINED)
{
	const VkAttachmentDescription colorAttachmentDescription =
	{
		(VkAttachmentDescriptionFlags)0,					// VkAttachmentDescriptionFlags		flags;
		colorFormat,										// VkFormat							format;
		VK_SAMPLE_COUNT_1_BIT,								// VkSampleCountFlagBits			samples;
		VK_ATTACHMENT_LOAD_OP_CLEAR,						// VkAttachmentLoadOp				loadOp;
		VK_ATTACHMENT_STORE_OP_STORE,						// VkAttachmentStoreOp				storeOp;
		VK_ATTACHMENT_LOAD_OP_DONT_CARE,					// VkAttachmentLoadOp				stencilLoadOp;
		VK_ATTACHMENT_STORE_OP_DONT_CARE,					// VkAttachmentStoreOp				stencilStoreOp;
		initialColorImageLayout,							// VkImageLayout					initialLayout;
		VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,			// VkImageLayout					finalLayout;
	};
	vector<VkAttachmentDescription> attachmentDescriptions(numLayers, colorAttachmentDescription);

	const VkAttachmentDescription depthStencilAttachmentDescription =
	{
		(VkAttachmentDescriptionFlags)0,					// VkAttachmentDescriptionFlags		flags;
		depthStencilFormat,									// VkFormat							format;
		VK_SAMPLE_COUNT_1_BIT,								// VkSampleCountFlagBits			samples;
		VK_ATTACHMENT_LOAD_OP_CLEAR,						// VkAttachmentLoadOp				loadOp;
		VK_ATTACHMENT_STORE_OP_DONT_CARE,					// VkAttachmentStoreOp				storeOp;
		VK_ATTACHMENT_LOAD_OP_CLEAR,						// VkAttachmentLoadOp				stencilLoadOp;
		VK_ATTACHMENT_STORE_OP_DONT_CARE,					// VkAttachmentStoreOp				stencilStoreOp;
		initialDepthStencilImageLayout,						// VkImageLayout					initialLayout;
		VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,	// VkImageLayout					finalLayout;
	};

	if (depthStencilFormat != VK_FORMAT_UNDEFINED)
		attachmentDescriptions.insert(attachmentDescriptions.end(), numLayers, depthStencilAttachmentDescription);

	// Create a subpass for each attachment (each attachement is a layer of an arrayed image).
	vector<VkAttachmentReference>	colorAttachmentReferences		(numLayers);
	vector<VkAttachmentReference>	depthStencilAttachmentReferences(numLayers);
	vector<VkSubpassDescription>	subpasses;

	// Ordering here must match the framebuffer attachments
	for (deUint32 i = 0; i < numLayers; ++i)
	{
		const VkAttachmentReference attachmentRef =
		{
			i,													// deUint32			attachment;
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL			// VkImageLayout	layout;
		};
		const VkAttachmentReference depthStencilAttachmentRef =
		{
			i + numLayers,										// deUint32			attachment;
			VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL	// VkImageLayout	layout;
		};

		colorAttachmentReferences[i]		= attachmentRef;
		depthStencilAttachmentReferences[i]	= depthStencilAttachmentRef;

		const VkAttachmentReference*	pDepthStencilAttachment	= (depthStencilFormat != VK_FORMAT_UNDEFINED ? &depthStencilAttachmentReferences[i] : DE_NULL);
		const VkSubpassDescription		subpassDescription		=
		{
			(VkSubpassDescriptionFlags)0,					// VkSubpassDescriptionFlags		flags;
			VK_PIPELINE_BIND_POINT_GRAPHICS,				// VkPipelineBindPoint				pipelineBindPoint;
			0u,												// deUint32							inputAttachmentCount;
			DE_NULL,										// const VkAttachmentReference*		pInputAttachments;
			1u,												// deUint32							colorAttachmentCount;
			&colorAttachmentReferences[i],					// const VkAttachmentReference*		pColorAttachments;
			DE_NULL,										// const VkAttachmentReference*		pResolveAttachments;
			pDepthStencilAttachment,						// const VkAttachmentReference*		pDepthStencilAttachment;
			0u,												// deUint32							preserveAttachmentCount;
			DE_NULL											// const deUint32*					pPreserveAttachments;
		};
		subpasses.push_back(subpassDescription);
	}

	const VkRenderPassCreateInfo renderPassInfo =
	{
		VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,				// VkStructureType					sType;
		DE_NULL,												// const void*						pNext;
		(VkRenderPassCreateFlags)0,								// VkRenderPassCreateFlags			flags;
		static_cast<deUint32>(attachmentDescriptions.size()),	// deUint32							attachmentCount;
		&attachmentDescriptions[0],								// const VkAttachmentDescription*	pAttachments;
		static_cast<deUint32>(subpasses.size()),				// deUint32							subpassCount;
		&subpasses[0],											// const VkSubpassDescription*		pSubpasses;
		0u,														// deUint32							dependencyCount;
		DE_NULL													// const VkSubpassDependency*		pDependencies;
	};

	return createRenderPass(vk, device, &renderPassInfo);
}